

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O1

_Bool duckdb_je_ckh_remove(tsd_t *tsd,ckh_t *ckh,void *searchkey,void **key,void **data)

{
  long *plVar1;
  rtree_ctx_cache_elm_t *prVar2;
  void *pvVar3;
  ckhc_t *aTab;
  arena_t *paVar4;
  rtree_leaf_elm_t *prVar5;
  long lVar6;
  _Bool _Var7;
  size_t sVar8;
  ulong uVar9;
  ckhc_t *pcVar10;
  rtree_leaf_elm_t *prVar11;
  atomic_p_t arena;
  byte bVar12;
  ulong uVar13;
  undefined8 *puVar14;
  rtree_ctx_cache_elm_t *prVar15;
  rtree_ctx_cache_elm_t *prVar16;
  uint uVar17;
  uint uVar18;
  rtree_leaf_elm_t *prVar19;
  rtree_ctx_t *prVar20;
  size_t usize;
  bool bVar21;
  rtree_ctx_t rtree_ctx_fallback;
  
  sVar8 = ckh_isearch(ckh,searchkey);
  if (sVar8 == 0xffffffffffffffff) goto LAB_00d0e272;
  if (key != (void **)0x0) {
    *key = ckh->tab[sVar8].key;
  }
  if (data != (void **)0x0) {
    *data = ckh->tab[sVar8].data;
  }
  pcVar10 = ckh->tab;
  pcVar10[sVar8].key = (void *)0x0;
  pcVar10[sVar8].data = (void *)0x0;
  uVar9 = ckh->count - 1;
  ckh->count = uVar9;
  uVar18 = ckh->lg_curbuckets;
  if ((uVar9 >> ((byte)uVar18 & 0x3f) != 0) || (uVar18 <= ckh->lg_minbuckets)) goto LAB_00d0e272;
  bVar12 = (byte)uVar18 + 1;
  uVar9 = 0x10L << (bVar12 & 0x3f);
  if (uVar9 < 0x3801) {
    uVar17 = (int)uVar9 + 0x3fU & 0x7fc0;
    if (uVar17 < 0x1001) {
      usize = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar17 >> 3]];
    }
    else {
      uVar13 = (ulong)uVar17 * 2 - 1;
      lVar6 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      uVar13 = -1L << (0x3c - ((byte)lVar6 ^ 0x3f) & 0x3f);
      usize = ~uVar13 + (ulong)uVar17 & uVar13;
    }
    if (0x3fff < usize) goto LAB_00d0dee3;
  }
  else {
LAB_00d0dee3:
    uVar13 = 0x4000;
    if (0x4000 < uVar9) {
      if (uVar9 < 0x7000000000000001) {
        uVar13 = (0x20L << (bVar12 & 0x3f)) - 1;
        lVar6 = 0x3f;
        if (uVar13 != 0) {
          for (; uVar13 >> lVar6 == 0; lVar6 = lVar6 + -1) {
          }
        }
        uVar13 = -1L << (0x3c - ((byte)lVar6 ^ 0x3f) & 0x3f);
        uVar13 = ~uVar13 + uVar9 & uVar13;
      }
      else {
        uVar13 = 0;
      }
      if (uVar13 < uVar9) {
        usize = 0;
        goto LAB_00d0df47;
      }
    }
    usize = 0;
    if (!CARRY8(duckdb_je_sz_large_pad,uVar13)) {
      usize = uVar13;
    }
  }
LAB_00d0df47:
  if (0x8fffffffffffffff < usize + 0x8fffffffffffffff) {
    if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level < '\x01') {
      arena.repr = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_iarena;
      if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_iarena == (arena_t *)0x0) &&
         (arena.repr = duckdb_je_arena_choose_hard(tsd,true),
         tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true)) {
        paVar4 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow).arena;
        if (paVar4 == (arena_t *)0x0) {
          duckdb_je_tcache_arena_associate
                    ((tsdn_t *)tsd,
                     &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow,
                     &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,
                     (arena_t *)arena.repr);
        }
        else if (paVar4 != (arena_t *)arena.repr) {
          duckdb_je_tcache_arena_reassociate
                    ((tsdn_t *)tsd,
                     &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow,
                     &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,
                     (arena_t *)arena.repr);
        }
      }
    }
    else {
      arena = duckdb_je_arenas[0];
      if (duckdb_je_arenas[0].repr == (void *)0x0) {
        arena.repr = duckdb_je_arena_init((tsdn_t *)tsd,0,&duckdb_je_arena_config_default);
      }
    }
    pcVar10 = (ckhc_t *)
              duckdb_je_arena_palloc
                        ((tsdn_t *)tsd,(arena_t *)arena.repr,usize,0x40,true,usize < 0x3801,
                         (tcache_t *)0x0);
    if (pcVar10 != (ckhc_t *)0x0) {
      if (tsd == (tsd_t *)0x0) {
        prVar20 = &rtree_ctx_fallback;
        duckdb_je_rtree_ctx_data_init(prVar20);
      }
      else {
        prVar20 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      }
      uVar17 = (uint)((ulong)pcVar10 >> 0x1e) & 0xf;
      prVar19 = (rtree_leaf_elm_t *)((ulong)pcVar10 & 0xffffffffc0000000);
      uVar9 = (ulong)(uVar17 << 4);
      puVar14 = (undefined8 *)((long)&prVar20->cache[0].leafkey + uVar9);
      prVar11 = *(rtree_leaf_elm_t **)((long)&prVar20->cache[0].leafkey + uVar9);
      if (prVar11 == prVar19) {
        prVar11 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)pcVar10 >> 9) & 0x1ffff8) + puVar14[1])
        ;
      }
      else if ((rtree_leaf_elm_t *)prVar20->l2_cache[0].leafkey == prVar19) {
        prVar5 = prVar20->l2_cache[0].leaf;
        prVar20->l2_cache[0].leafkey = (uintptr_t)prVar11;
        prVar20->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar14[1];
        *puVar14 = prVar19;
        puVar14[1] = prVar5;
        prVar11 = (rtree_leaf_elm_t *)
                  ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)pcVar10 >> 9) & 0x1ffff8));
      }
      else {
        prVar15 = prVar20->l2_cache + 1;
        if ((rtree_leaf_elm_t *)prVar20->l2_cache[1].leafkey == prVar19) {
          uVar9 = 0;
          bVar21 = false;
        }
        else {
          uVar9 = 0;
          prVar16 = prVar15;
          do {
            if (uVar9 == 6) {
              bVar21 = true;
              goto LAB_00d0e5d9;
            }
            prVar15 = prVar16 + 1;
            uVar9 = uVar9 + 1;
            prVar2 = prVar16 + 1;
            prVar16 = prVar15;
          } while ((rtree_leaf_elm_t *)prVar2->leafkey != prVar19);
          bVar21 = 6 < uVar9;
        }
        prVar5 = prVar15->leaf;
        prVar15->leafkey = prVar20->l2_cache[uVar9].leafkey;
        prVar15->leaf = prVar20->l2_cache[uVar9].leaf;
        prVar20->l2_cache[uVar9].leafkey = (uintptr_t)prVar11;
        prVar20->l2_cache[uVar9].leaf = (rtree_leaf_elm_t *)puVar14[1];
        *puVar14 = prVar19;
        puVar14[1] = prVar5;
        prVar11 = (rtree_leaf_elm_t *)
                  ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)pcVar10 >> 9) & 0x1ffff8));
LAB_00d0e5d9:
        if (bVar21) {
          prVar11 = duckdb_je_rtree_leaf_elm_lookup_hard
                              ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar20,
                               (uintptr_t)pcVar10,true,false);
        }
      }
      pvVar3 = duckdb_je_arenas
               [*(uint *)(((long)(prVar11->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80) &
                0xfff].repr;
      if (tsd == (tsd_t *)0x0) {
        prVar20 = &rtree_ctx_fallback;
        duckdb_je_rtree_ctx_data_init(prVar20);
      }
      else {
        prVar20 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      }
      uVar9 = (ulong)(uVar17 << 4);
      puVar14 = (undefined8 *)((long)&prVar20->cache[0].leafkey + uVar9);
      prVar11 = *(rtree_leaf_elm_t **)((long)&prVar20->cache[0].leafkey + uVar9);
      if (prVar11 == prVar19) {
        prVar11 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)pcVar10 >> 9) & 0x1ffff8) + puVar14[1])
        ;
      }
      else if ((rtree_leaf_elm_t *)prVar20->l2_cache[0].leafkey == prVar19) {
        prVar5 = prVar20->l2_cache[0].leaf;
        prVar20->l2_cache[0].leafkey = (uintptr_t)prVar11;
        prVar20->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar14[1];
        *puVar14 = prVar19;
        puVar14[1] = prVar5;
        prVar11 = (rtree_leaf_elm_t *)
                  ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)pcVar10 >> 9) & 0x1ffff8));
      }
      else {
        prVar15 = prVar20->l2_cache + 1;
        if ((rtree_leaf_elm_t *)prVar20->l2_cache[1].leafkey == prVar19) {
          uVar9 = 0;
          bVar21 = false;
        }
        else {
          uVar9 = 0;
          prVar16 = prVar15;
          do {
            if (uVar9 == 6) {
              bVar21 = true;
              goto LAB_00d0e663;
            }
            prVar15 = prVar16 + 1;
            uVar9 = uVar9 + 1;
            prVar2 = prVar16 + 1;
            prVar16 = prVar15;
          } while ((rtree_leaf_elm_t *)prVar2->leafkey != prVar19);
          bVar21 = 6 < uVar9;
        }
        prVar5 = prVar15->leaf;
        prVar15->leafkey = prVar20->l2_cache[uVar9].leafkey;
        prVar15->leaf = prVar20->l2_cache[uVar9].leaf;
        prVar20->l2_cache[uVar9].leafkey = (uintptr_t)prVar11;
        prVar20->l2_cache[uVar9].leaf = (rtree_leaf_elm_t *)puVar14[1];
        *puVar14 = prVar19;
        puVar14[1] = prVar5;
        prVar11 = (rtree_leaf_elm_t *)
                  ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)pcVar10 >> 9) & 0x1ffff8));
LAB_00d0e663:
        if (bVar21) {
          prVar11 = duckdb_je_rtree_leaf_elm_lookup_hard
                              ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar20,
                               (uintptr_t)pcVar10,true,false);
        }
      }
      LOCK();
      plVar1 = (long *)((long)pvVar3 + 0x48);
      *plVar1 = *plVar1 + duckdb_je_sz_index2size_tab[(ulong)(prVar11->le_bits).repr >> 0x30];
      UNLOCK();
      aTab = ckh->tab;
      ckh->tab = pcVar10;
      ckh->lg_curbuckets = uVar18 - 1;
      _Var7 = ckh_rebuild(ckh,aTab);
      if (_Var7) {
        pcVar10 = ckh->tab;
        if (tsd == (tsd_t *)0x0) {
          prVar20 = &rtree_ctx_fallback;
          duckdb_je_rtree_ctx_data_init(prVar20);
        }
        else {
          prVar20 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
        }
        uVar17 = (uint)((ulong)pcVar10 >> 0x1e) & 0xf;
        prVar19 = (rtree_leaf_elm_t *)((ulong)pcVar10 & 0xffffffffc0000000);
        uVar9 = (ulong)(uVar17 << 4);
        puVar14 = (undefined8 *)((long)&prVar20->cache[0].leafkey + uVar9);
        prVar11 = *(rtree_leaf_elm_t **)((long)&prVar20->cache[0].leafkey + uVar9);
        if (prVar11 == prVar19) {
          prVar11 = (rtree_leaf_elm_t *)
                    ((ulong)((uint)((ulong)pcVar10 >> 9) & 0x1ffff8) + puVar14[1]);
        }
        else if ((rtree_leaf_elm_t *)prVar20->l2_cache[0].leafkey == prVar19) {
          prVar5 = prVar20->l2_cache[0].leaf;
          prVar20->l2_cache[0].leafkey = (uintptr_t)prVar11;
          prVar20->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar14[1];
          *puVar14 = prVar19;
          puVar14[1] = prVar5;
          prVar11 = (rtree_leaf_elm_t *)
                    ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)pcVar10 >> 9) & 0x1ffff8)
                    );
        }
        else {
          prVar15 = prVar20->l2_cache + 1;
          if ((rtree_leaf_elm_t *)prVar20->l2_cache[1].leafkey == prVar19) {
            uVar9 = 0;
            bVar21 = false;
          }
          else {
            uVar9 = 0;
            prVar16 = prVar15;
            do {
              if (uVar9 == 6) {
                bVar21 = true;
                goto LAB_00d0e6f7;
              }
              prVar15 = prVar16 + 1;
              uVar9 = uVar9 + 1;
              prVar2 = prVar16 + 1;
              prVar16 = prVar15;
            } while ((rtree_leaf_elm_t *)prVar2->leafkey != prVar19);
            bVar21 = 6 < uVar9;
          }
          prVar5 = prVar15->leaf;
          prVar15->leafkey = prVar20->l2_cache[uVar9].leafkey;
          prVar15->leaf = prVar20->l2_cache[uVar9].leaf;
          prVar20->l2_cache[uVar9].leafkey = (uintptr_t)prVar11;
          prVar20->l2_cache[uVar9].leaf = (rtree_leaf_elm_t *)puVar14[1];
          *puVar14 = prVar19;
          puVar14[1] = prVar5;
          prVar11 = (rtree_leaf_elm_t *)
                    ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)pcVar10 >> 9) & 0x1ffff8)
                    );
LAB_00d0e6f7:
          if (bVar21) {
            prVar11 = duckdb_je_rtree_leaf_elm_lookup_hard
                                ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar20,
                                 (uintptr_t)pcVar10,true,false);
          }
        }
        pvVar3 = duckdb_je_arenas
                 [*(uint *)(((long)(prVar11->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80) &
                  0xfff].repr;
        if (tsd == (tsd_t *)0x0) {
          prVar20 = &rtree_ctx_fallback;
          duckdb_je_rtree_ctx_data_init(prVar20);
        }
        else {
          prVar20 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
        }
        uVar9 = (ulong)(uVar17 << 4);
        puVar14 = (undefined8 *)((long)&prVar20->cache[0].leafkey + uVar9);
        prVar11 = *(rtree_leaf_elm_t **)((long)&prVar20->cache[0].leafkey + uVar9);
        if (prVar11 == prVar19) {
          prVar11 = (rtree_leaf_elm_t *)
                    ((ulong)((uint)((ulong)pcVar10 >> 9) & 0x1ffff8) + puVar14[1]);
        }
        else if ((rtree_leaf_elm_t *)prVar20->l2_cache[0].leafkey == prVar19) {
          prVar5 = prVar20->l2_cache[0].leaf;
          prVar20->l2_cache[0].leafkey = (uintptr_t)prVar11;
          prVar20->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar14[1];
          *puVar14 = prVar19;
          puVar14[1] = prVar5;
          prVar11 = (rtree_leaf_elm_t *)
                    ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)pcVar10 >> 9) & 0x1ffff8)
                    );
        }
        else {
          prVar15 = prVar20->l2_cache + 1;
          if ((rtree_leaf_elm_t *)prVar20->l2_cache[1].leafkey == prVar19) {
            uVar9 = 0;
            bVar21 = false;
          }
          else {
            uVar9 = 0;
            prVar16 = prVar15;
            do {
              if (uVar9 == 6) {
                bVar21 = true;
                goto LAB_00d0e77b;
              }
              prVar15 = prVar16 + 1;
              uVar9 = uVar9 + 1;
              prVar2 = prVar16 + 1;
              prVar16 = prVar15;
            } while ((rtree_leaf_elm_t *)prVar2->leafkey != prVar19);
            bVar21 = 6 < uVar9;
          }
          prVar5 = prVar15->leaf;
          prVar15->leafkey = prVar20->l2_cache[uVar9].leafkey;
          prVar15->leaf = prVar20->l2_cache[uVar9].leaf;
          prVar20->l2_cache[uVar9].leafkey = (uintptr_t)prVar11;
          prVar20->l2_cache[uVar9].leaf = (rtree_leaf_elm_t *)puVar14[1];
          *puVar14 = prVar19;
          puVar14[1] = prVar5;
          prVar11 = (rtree_leaf_elm_t *)
                    ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)pcVar10 >> 9) & 0x1ffff8)
                    );
LAB_00d0e77b:
          if (bVar21) {
            prVar11 = duckdb_je_rtree_leaf_elm_lookup_hard
                                ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar20,
                                 (uintptr_t)pcVar10,true,false);
          }
        }
        LOCK();
        plVar1 = (long *)((long)pvVar3 + 0x48);
        *plVar1 = *plVar1 - duckdb_je_sz_index2size_tab[(ulong)(prVar11->le_bits).repr >> 0x30];
        UNLOCK();
        arena_dalloc_no_tcache((tsdn_t *)tsd,pcVar10);
        ckh->tab = aTab;
        ckh->lg_curbuckets = uVar18;
      }
      else {
        if (tsd == (tsd_t *)0x0) {
          prVar20 = &rtree_ctx_fallback;
          duckdb_je_rtree_ctx_data_init(prVar20);
        }
        else {
          prVar20 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
        }
        uVar18 = (uint)((ulong)aTab >> 0x1e) & 0xf;
        prVar19 = (rtree_leaf_elm_t *)((ulong)aTab & 0xffffffffc0000000);
        uVar9 = (ulong)(uVar18 << 4);
        puVar14 = (undefined8 *)((long)&prVar20->cache[0].leafkey + uVar9);
        prVar11 = *(rtree_leaf_elm_t **)((long)&prVar20->cache[0].leafkey + uVar9);
        if (prVar11 == prVar19) {
          prVar11 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)aTab >> 9) & 0x1ffff8) + puVar14[1]);
        }
        else if ((rtree_leaf_elm_t *)prVar20->l2_cache[0].leafkey == prVar19) {
          prVar5 = prVar20->l2_cache[0].leaf;
          prVar20->l2_cache[0].leafkey = (uintptr_t)prVar11;
          prVar20->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar14[1];
          *puVar14 = prVar19;
          puVar14[1] = prVar5;
          prVar11 = (rtree_leaf_elm_t *)
                    ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)aTab >> 9) & 0x1ffff8));
        }
        else {
          prVar15 = prVar20->l2_cache + 1;
          if ((rtree_leaf_elm_t *)prVar20->l2_cache[1].leafkey == prVar19) {
            uVar9 = 0;
            bVar21 = false;
          }
          else {
            uVar9 = 0;
            prVar16 = prVar15;
            do {
              if (uVar9 == 6) {
                bVar21 = true;
                goto LAB_00d0e80c;
              }
              prVar15 = prVar16 + 1;
              uVar9 = uVar9 + 1;
              prVar2 = prVar16 + 1;
              prVar16 = prVar15;
            } while ((rtree_leaf_elm_t *)prVar2->leafkey != prVar19);
            bVar21 = 6 < uVar9;
          }
          prVar5 = prVar15->leaf;
          prVar15->leafkey = prVar20->l2_cache[uVar9].leafkey;
          prVar15->leaf = prVar20->l2_cache[uVar9].leaf;
          prVar20->l2_cache[uVar9].leafkey = (uintptr_t)prVar11;
          prVar20->l2_cache[uVar9].leaf = (rtree_leaf_elm_t *)puVar14[1];
          *puVar14 = prVar19;
          puVar14[1] = prVar5;
          prVar11 = (rtree_leaf_elm_t *)
                    ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)aTab >> 9) & 0x1ffff8));
LAB_00d0e80c:
          if (bVar21) {
            prVar11 = duckdb_je_rtree_leaf_elm_lookup_hard
                                ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar20,
                                 (uintptr_t)aTab,true,false);
          }
        }
        pvVar3 = duckdb_je_arenas
                 [*(uint *)(((long)(prVar11->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80) &
                  0xfff].repr;
        if (tsd == (tsd_t *)0x0) {
          prVar20 = &rtree_ctx_fallback;
          duckdb_je_rtree_ctx_data_init(prVar20);
        }
        else {
          prVar20 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
        }
        uVar9 = (ulong)(uVar18 << 4);
        puVar14 = (undefined8 *)((long)&prVar20->cache[0].leafkey + uVar9);
        prVar11 = *(rtree_leaf_elm_t **)((long)&prVar20->cache[0].leafkey + uVar9);
        if (prVar11 == prVar19) {
          prVar11 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)aTab >> 9) & 0x1ffff8) + puVar14[1]);
        }
        else if ((rtree_leaf_elm_t *)prVar20->l2_cache[0].leafkey == prVar19) {
          prVar5 = prVar20->l2_cache[0].leaf;
          prVar20->l2_cache[0].leafkey = (uintptr_t)prVar11;
          prVar20->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar14[1];
          *puVar14 = prVar19;
          puVar14[1] = prVar5;
          prVar11 = (rtree_leaf_elm_t *)
                    ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)aTab >> 9) & 0x1ffff8));
        }
        else {
          prVar15 = prVar20->l2_cache + 1;
          if ((rtree_leaf_elm_t *)prVar20->l2_cache[1].leafkey == prVar19) {
            uVar9 = 0;
            bVar21 = false;
          }
          else {
            uVar9 = 0;
            prVar16 = prVar15;
            do {
              if (uVar9 == 6) {
                bVar21 = true;
                goto LAB_00d0e8a0;
              }
              prVar15 = prVar16 + 1;
              uVar9 = uVar9 + 1;
              prVar2 = prVar16 + 1;
              prVar16 = prVar15;
            } while ((rtree_leaf_elm_t *)prVar2->leafkey != prVar19);
            bVar21 = 6 < uVar9;
          }
          prVar5 = prVar15->leaf;
          prVar15->leafkey = prVar20->l2_cache[uVar9].leafkey;
          prVar15->leaf = prVar20->l2_cache[uVar9].leaf;
          prVar20->l2_cache[uVar9].leafkey = (uintptr_t)prVar11;
          prVar20->l2_cache[uVar9].leaf = (rtree_leaf_elm_t *)puVar14[1];
          *puVar14 = prVar19;
          puVar14[1] = prVar5;
          prVar11 = (rtree_leaf_elm_t *)
                    ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)aTab >> 9) & 0x1ffff8));
LAB_00d0e8a0:
          if (bVar21) {
            prVar11 = duckdb_je_rtree_leaf_elm_lookup_hard
                                ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar20,
                                 (uintptr_t)aTab,true,false);
          }
        }
        LOCK();
        plVar1 = (long *)((long)pvVar3 + 0x48);
        *plVar1 = *plVar1 - duckdb_je_sz_index2size_tab[(ulong)(prVar11->le_bits).repr >> 0x30];
        UNLOCK();
        arena_dalloc_no_tcache((tsdn_t *)tsd,aTab);
      }
    }
  }
LAB_00d0e272:
  return sVar8 == 0xffffffffffffffff;
}

Assistant:

bool
ckh_remove(tsd_t *tsd, ckh_t *ckh, const void *searchkey, void **key,
    void **data) {
	size_t cell;

	assert(ckh != NULL);

	cell = ckh_isearch(ckh, searchkey);
	if (cell != SIZE_T_MAX) {
		if (key != NULL) {
			*key = (void *)ckh->tab[cell].key;
		}
		if (data != NULL) {
			*data = (void *)ckh->tab[cell].data;
		}
		ckh->tab[cell].key = NULL;
		ckh->tab[cell].data = NULL; /* Not necessary. */

		ckh->count--;
		/* Try to halve the table if it is less than 1/4 full. */
		if (ckh->count < (ZU(1) << (ckh->lg_curbuckets
		    + LG_CKH_BUCKET_CELLS - 2)) && ckh->lg_curbuckets
		    > ckh->lg_minbuckets) {
			/* Ignore error due to OOM. */
			ckh_shrink(tsd, ckh);
		}

		return false;
	}

	return true;
}